

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QMainWindowLayoutState::contains(QMainWindowLayoutState *this,QWidget *widget)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar2;
  QDockAreaLayout *in_stack_ffffffffffffffc8;
  QWidget *in_stack_fffffffffffffff0;
  QToolBarAreaLayout *this_00;
  
  this_00 = *(QToolBarAreaLayout **)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x138) != 0) {
    lVar1 = (**(code **)(**(long **)(in_RDI + 0x138) + 0x68))();
    if (lVar1 == in_RSI) {
      bVar2 = true;
      goto LAB_005f3d65;
    }
  }
  QDockAreaLayout::indexOf
            (in_stack_ffffffffffffffc8,
             (QWidget *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = QList<int>::isEmpty((QList<int> *)0x5f3cfc);
  QList<int>::~QList((QList<int> *)0x5f3d0c);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    QToolBarAreaLayout::indexOf(this_00,in_stack_fffffffffffffff0);
    bVar2 = QList<int>::isEmpty((QList<int> *)0x5f3d3f);
    QList<int>::~QList((QList<int> *)0x5f3d4f);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
    }
  }
  else {
    bVar2 = true;
  }
LAB_005f3d65:
  if (*(QToolBarAreaLayout **)(in_FS_OFFSET + 0x28) == this_00) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::contains(QWidget *widget) const
{
#if QT_CONFIG(dockwidget)
    if (dockAreaLayout.centralWidgetItem != nullptr && dockAreaLayout.centralWidgetItem->widget() == widget)
        return true;
    if (!dockAreaLayout.indexOf(widget).isEmpty())
        return true;
#else
    if (centralWidgetItem && centralWidgetItem->widget() == widget)
        return true;
#endif

#if QT_CONFIG(toolbar)
    if (!toolBarAreaLayout.indexOf(widget).isEmpty())
        return true;
#endif
    return false;
}